

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_utils.h
# Opt level: O1

void __thiscall
ktx::OptionsDeflate::process
          (OptionsDeflate *this,Options *param_1,ParseResult *args,Reporter *report)

{
  bool bVar1;
  size_t sVar2;
  uint uVar3;
  OptionValue *pOVar4;
  allocator<char> local_51;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,kZStd,&local_51);
  pOVar4 = cxxopts::ParseResult::operator[](args,&local_50);
  sVar2 = pOVar4->m_count;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (sVar2 != 0) {
    uVar3 = captureCompressOption<unsigned_int>(this,args,kZStd);
    (this->zstd).super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int> =
         (_Optional_payload_base<unsigned_int>)((ulong)uVar3 | 0x100000000);
    bVar1 = (this->zstd).super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_engaged;
    if (((bVar1 != true) || (uVar3 == 0)) || (0x16 < uVar3)) {
      if (bVar1 == false) goto LAB_0016e0f5;
      Reporter::fatal_usage<char_const(&)[68],unsigned_int&>
                (report,(char (*) [68])
                        "Invalid zstd level: \"{}\". Value must be between 1 and 22 inclusive.",
                 (uint *)&this->zstd);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,kZLib,&local_51);
  pOVar4 = cxxopts::ParseResult::operator[](args,&local_50);
  sVar2 = pOVar4->m_count;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (sVar2 != 0) {
    uVar3 = captureCompressOption<unsigned_int>(this,args,kZLib);
    (this->zlib).super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int> =
         (_Optional_payload_base<unsigned_int>)((ulong)uVar3 | 0x100000000);
    bVar1 = (this->zlib).super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_engaged;
    if (((bVar1 != true) || (uVar3 == 0)) || (9 < uVar3)) {
      if (bVar1 == false) {
LAB_0016e0f5:
        std::__throw_bad_optional_access();
      }
      Reporter::fatal_usage<char_const(&)[67],unsigned_int&>
                (report,(char (*) [67])
                        "Invalid zlib level: \"{}\". Value must be between 1 and 9 inclusive.",
                 (uint *)&this->zlib);
    }
  }
  if (((this->zstd).super__Optional_base<unsigned_int,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_int>._M_engaged == true) &&
     ((this->zlib).super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged == true)) {
    Reporter::fatal_usage<char_const(&)[68]>
              (report,(char (*) [68])
                      "Conflicting options: zstd and zlib cannot be used at the same time.");
  }
  return;
}

Assistant:

void process(cxxopts::Options&, cxxopts::ParseResult& args, Reporter& report) {
        if (args[kZStd].count()) {
            zstd = captureCompressOption<uint32_t>(args, kZStd);
            if (zstd < 1u || zstd > 22u)
                report.fatal_usage("Invalid zstd level: \"{}\". Value must be between 1 and 22 inclusive.", zstd.value());
        }
        if (args[kZLib].count()) {
            zlib = captureCompressOption<uint32_t>(args, kZLib);
            if (zlib < 1u || zlib > 9u)
                report.fatal_usage("Invalid zlib level: \"{}\". Value must be between 1 and 9 inclusive.", zlib.value());
        }
        if (zstd.has_value() && zlib.has_value())
            report.fatal_usage("Conflicting options: zstd and zlib cannot be used at the same time.");
    }